

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

int __thiscall AddrInfo::GetBucketPosition(AddrInfo *this,uint256 *nKey,bool fNew,int bucket)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  byte in_DL;
  long in_FS_OFFSET;
  uint64_t hash1;
  HashWriter *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  HashWriter *in_stack_ffffffffffffff08;
  uint local_b8;
  CService local_98;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_98.port = 0;
  local_98._34_6_ = 0;
  uStack_70 = 0;
  local_18 = 0;
  HashWriter::HashWriter(in_stack_fffffffffffffef8);
  HashWriter::operator<<
            (in_stack_ffffffffffffff08,
             (uint256 *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  local_98.super_CNetAddr.m_net._3_1_ = ((in_DL & 1) != 0) * '\x03' + 0x4b;
  HashWriter::operator<<
            (in_stack_ffffffffffffff08,
             (uchar *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  HashWriter::operator<<
            (in_stack_ffffffffffffff08,
             (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  CService::GetKey(&local_98);
  HashWriter::operator<<
            (in_stack_ffffffffffffff08,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
            HashWriter::GetCheapHash(in_stack_ffffffffffffff08);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this_00);
  local_b8 = (uint)this_00;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_b8 & 0x3f;
  }
  __stack_chk_fail();
}

Assistant:

int AddrInfo::GetBucketPosition(const uint256& nKey, bool fNew, int bucket) const
{
    uint64_t hash1 = (HashWriter{} << nKey << (fNew ? uint8_t{'N'} : uint8_t{'K'}) << bucket << GetKey()).GetCheapHash();
    return hash1 % ADDRMAN_BUCKET_SIZE;
}